

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  long local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  long local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  long local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  int local_34;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) {
      UnitTest::GetInstance();
      iVar1 = chdir(((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                    _M_dataplus._M_p);
      if (iVar1 != 0) {
        paVar10 = &local_c8;
        local_d8 = paVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"chdir(\"","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
        paVar11 = &local_a8;
        local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar3;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if (local_b8 == paVar8) {
          local_a8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_a8._8_8_ = plVar3[3];
          local_b8 = paVar11;
        }
        else {
          local_a8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)paVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
        paVar8 = &local_128;
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar4 + 2);
        if (local_138 == paVar9) {
          local_128._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_128._8_8_ = puVar4[3];
          local_138 = paVar8;
        }
        else {
          local_128._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_130 = puVar4[1];
        *puVar4 = paVar9;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar7 = 0xf;
        if (local_138 != paVar8) {
          uVar7 = local_128._M_allocated_capacity;
        }
        paVar9 = &local_e8;
        if ((ulong)uVar7 < (ulong)(local_f0 + local_130)) {
          uVar7 = 0xf;
          if (local_f8 != paVar9) {
            uVar7 = local_e8._M_allocated_capacity;
          }
          if ((ulong)uVar7 < (ulong)(local_f0 + local_130)) goto LAB_00150875;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_138);
        }
        else {
LAB_00150875:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8)
          ;
        }
        local_118._M_dataplus._M_p = (pointer)*puVar4;
        psVar5 = puVar4 + 2;
        if ((size_type *)local_118._M_dataplus._M_p == psVar5) {
          local_118.field_2._M_allocated_capacity = *psVar5;
          local_118.field_2._8_8_ = puVar4[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar5;
        }
        local_118._M_string_length = puVar4[1];
        *puVar4 = psVar5;
        puVar4[1] = 0;
        *(undefined1 *)psVar5 = 0;
        DeathTestAbort(&local_118);
        puVar4 = extraout_RAX;
        local_b8 = extraout_RDX;
        goto LAB_00150a7e;
      }
      execv(**child_arg,*child_arg);
      paVar11 = &local_68;
      local_78 = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"execv(","");
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
      paVar10 = &local_e8;
      local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if (local_f8 == paVar8) {
        local_e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_e8._8_8_ = puVar4[3];
        local_f8 = paVar10;
      }
      else {
        local_e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_f0 = puVar4[1];
      *puVar4 = paVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      paVar8 = &local_c8;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if (local_d8 == paVar9) {
        local_c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_c8._8_8_ = puVar4[3];
        local_d8 = paVar8;
      }
      else {
        local_c8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_d0 = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
      paVar9 = &local_a8;
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      psVar5 = puVar4 + 2;
      if (local_b8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_a8._M_allocated_capacity = *psVar5;
        local_a8._8_8_ = puVar4[3];
        local_b8 = paVar9;
      }
      else {
        local_a8._M_allocated_capacity = *psVar5;
      }
      local_b0 = puVar4[1];
      *puVar4 = psVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar3;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if (local_138 == paVar6) {
        local_128._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_128._8_8_ = plVar3[3];
        local_138 = &local_128;
      }
      else {
        local_128._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_130 = plVar3[1];
      *plVar3 = (long)paVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      GetLastErrnoDescription_abi_cxx11_();
      uVar7 = 0xf;
      if (local_138 != &local_128) {
        uVar7 = local_128._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (ulong)(local_90 + local_130)) {
        uVar7 = 0xf;
        if (local_98 != &local_88) {
          uVar7 = local_88._M_allocated_capacity;
        }
        if ((ulong)uVar7 < (ulong)(local_90 + local_130)) goto LAB_00150a35;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_138);
      }
      else {
LAB_00150a35:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_98);
      }
      local_118._M_dataplus._M_p = (pointer)*puVar4;
      psVar5 = puVar4 + 2;
      if ((size_type *)local_118._M_dataplus._M_p == psVar5) {
        local_118.field_2._M_allocated_capacity = *psVar5;
        local_118.field_2._8_8_ = puVar4[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar5;
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)puVar4[1];
      *puVar4 = psVar5;
      puVar4[1] = 0;
      *(undefined1 *)psVar5 = 0;
      local_118._M_string_length = (size_type)paVar6;
      DeathTestAbort(&local_118);
      puVar4 = extraout_RAX_00;
      local_118._M_dataplus._M_p = (pointer)extraout_RDX_00;
      goto LAB_00150b93;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  paVar10 = &local_88;
  local_98 = paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar11 = &local_68;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar3;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if (local_78 == paVar8) {
    local_68._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_68._8_8_ = plVar3[3];
    local_78 = paVar11;
  }
  else {
    local_68._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)paVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
  paVar8 = &local_e8;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar4;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if (local_f8 == paVar9) {
    local_e8._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_e8._8_8_ = puVar4[3];
    local_f8 = paVar8;
  }
  else {
    local_e8._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_f0 = puVar4[1];
  *puVar4 = paVar9;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_34 = 0x4d3;
  StreamableToString<int>(&local_58,&local_34);
  uVar7 = 0xf;
  if (local_f8 != paVar8) {
    uVar7 = local_e8._M_allocated_capacity;
  }
  paVar9 = &local_58.field_2;
  if ((ulong)uVar7 < local_58._M_string_length + local_f0) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar9) {
      uVar7 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_f0 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_f8);
      goto LAB_001508fe;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_58._M_dataplus._M_p);
LAB_001508fe:
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar4;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if (local_d8 == paVar6) {
    local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_c8._8_8_ = puVar4[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_d0 = puVar4[1];
  *puVar4 = paVar6;
  puVar4[1] = 0;
  paVar6->_M_local_buf[0] = '\0';
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar4;
  psVar5 = puVar4 + 2;
  if (local_b8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_a8._M_allocated_capacity = *psVar5;
    local_a8._8_8_ = puVar4[3];
    local_b8 = &local_a8;
  }
  else {
LAB_00150a7e:
    local_a8._M_allocated_capacity = *psVar5;
  }
  local_b0 = puVar4[1];
  *puVar4 = psVar5;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if (local_138 == paVar6) {
    local_128._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_128._8_8_ = puVar4[3];
    local_138 = &local_128;
  }
  else {
    local_128._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_130 = puVar4[1];
  *puVar4 = paVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
  paVar6 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)*puVar4;
  psVar5 = puVar4 + 2;
  if ((size_type *)local_118._M_dataplus._M_p == psVar5) {
    local_118.field_2._M_allocated_capacity = *psVar5;
    local_118.field_2._8_8_ = puVar4[3];
    local_118._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
LAB_00150b93:
    local_118.field_2._M_allocated_capacity = *psVar5;
  }
  local_118._M_string_length = puVar4[1];
  *puVar4 = psVar5;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  DeathTestAbort(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar6) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar9) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != paVar8) {
    operator_delete(local_f8,local_e8._M_allocated_capacity + 1);
  }
  if (local_78 != paVar11) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  if (local_98 != paVar10) {
    operator_delete(local_98,local_88._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}